

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Turtlebot.cpp
# Opt level: O0

void __thiscall chrono::turtlebot::Turtlebot_Part::AddVisualizationAssets(Turtlebot_Part *this)

{
  element_type *peVar1;
  element_type *peVar2;
  element_type *peVar3;
  ChQuaternion<double> local_1e0;
  ChVector<double> local_1c0;
  ChFrame<double> local_1a8;
  shared_ptr<chrono::ChVisualShape> local_120;
  shared_ptr<chrono::geometry::ChTriangleMeshConnected> local_110;
  undefined1 local_100 [8];
  shared_ptr<chrono::ChTriangleMeshShape> trimesh_shape;
  ChVector<double> local_a8;
  undefined1 local_90 [8];
  shared_ptr<chrono::geometry::ChTriangleMeshConnected> trimesh;
  string local_70 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50 [32];
  string local_30 [8];
  string vis_mesh_file;
  Turtlebot_Part *this_local;
  
  std::operator+((char *)local_70,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 "robot/turtlebot/");
  std::operator+(local_50,(char *)local_70);
  chrono::GetChronoDataFile(local_30);
  std::__cxx11::string::~string((string *)local_50);
  std::__cxx11::string::~string(local_70);
  chrono::geometry::ChTriangleMeshConnected::CreateFromWavefrontFile
            ((string *)local_90,SUB81(local_30,0),true);
  peVar1 = std::
           __shared_ptr_access<chrono::geometry::ChTriangleMeshConnected,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<chrono::geometry::ChTriangleMeshConnected,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_90);
  ChVector<double>::ChVector(&local_a8,&this->m_offset);
  ChMatrix33<double>::ChMatrix33
            ((ChMatrix33<double> *)
             &trimesh_shape.
              super___shared_ptr<chrono::ChTriangleMeshShape,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,1.0);
  (**(code **)(*(long *)peVar1 + 0x80))
            (peVar1,&local_a8,
             &trimesh_shape.
              super___shared_ptr<chrono::ChTriangleMeshShape,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  chrono_types::make_shared<chrono::ChTriangleMeshShape,_0>();
  peVar2 = std::
           __shared_ptr_access<chrono::ChTriangleMeshShape,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<chrono::ChTriangleMeshShape,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_100);
  std::shared_ptr<chrono::geometry::ChTriangleMeshConnected>::shared_ptr
            (&local_110,(shared_ptr<chrono::geometry::ChTriangleMeshConnected> *)local_90);
  chrono::ChTriangleMeshShape::SetMesh(peVar2,&local_110,1);
  std::shared_ptr<chrono::geometry::ChTriangleMeshConnected>::~shared_ptr(&local_110);
  peVar2 = std::
           __shared_ptr_access<chrono::ChTriangleMeshShape,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<chrono::ChTriangleMeshShape,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_100);
  ChTriangleMeshShape::SetName(peVar2,&this->m_mesh_name);
  peVar2 = std::
           __shared_ptr_access<chrono::ChTriangleMeshShape,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<chrono::ChTriangleMeshShape,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_100);
  ChVisualShape::SetMutable((ChVisualShape *)peVar2,false);
  peVar3 = std::__shared_ptr_access<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&this->m_body);
  std::shared_ptr<chrono::ChVisualShape>::shared_ptr<chrono::ChTriangleMeshShape,void>
            (&local_120,(shared_ptr<chrono::ChTriangleMeshShape> *)local_100);
  ChVector<double>::ChVector(&local_1c0,0.0,0.0,0.0);
  ChQuaternion<double>::ChQuaternion(&local_1e0,1.0,0.0,0.0,0.0);
  ChFrame<double>::ChFrame(&local_1a8,&local_1c0,&local_1e0);
  chrono::ChPhysicsItem::AddVisualShape(peVar3,&local_120,&local_1a8);
  ChFrame<double>::~ChFrame(&local_1a8);
  std::shared_ptr<chrono::ChVisualShape>::~shared_ptr(&local_120);
  std::shared_ptr<chrono::ChTriangleMeshShape>::~shared_ptr
            ((shared_ptr<chrono::ChTriangleMeshShape> *)local_100);
  std::shared_ptr<chrono::geometry::ChTriangleMeshConnected>::~shared_ptr
            ((shared_ptr<chrono::geometry::ChTriangleMeshConnected> *)local_90);
  std::__cxx11::string::~string(local_30);
  return;
}

Assistant:

void Turtlebot_Part::AddVisualizationAssets() {
    auto vis_mesh_file = GetChronoDataFile("robot/turtlebot/" + m_mesh_name + ".obj");
    auto trimesh = geometry::ChTriangleMeshConnected::CreateFromWavefrontFile(vis_mesh_file, true, true);
    trimesh->Transform(m_offset, ChMatrix33<>(1));
    auto trimesh_shape = chrono_types::make_shared<ChTriangleMeshShape>();
    trimesh_shape->SetMesh(trimesh);
    trimesh_shape->SetName(m_mesh_name);
    trimesh_shape->SetMutable(false);
    m_body->AddVisualShape(trimesh_shape);
    return;
}